

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopFusion::IsUsedInLoop(LoopFusion *this,Instruction *instruction,Loop *loop)

{
  Loop *def;
  bool bVar1;
  DefUseManager *this_00;
  anon_class_16_2_3fe2b05f local_58;
  function<bool_(spvtools::opt::Instruction_*)> local_48;
  Loop *pLStack_20;
  bool not_used;
  Loop *loop_local;
  Instruction *instruction_local;
  LoopFusion *this_local;
  
  pLStack_20 = loop;
  loop_local = (Loop *)instruction;
  instruction_local = (Instruction *)this;
  this_00 = IRContext::get_def_use_mgr(this->context_);
  def = loop_local;
  local_58.loop = pLStack_20;
  local_58.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopFusion::IsUsedInLoop(spvtools::opt::Instruction*,spvtools::opt::Loop*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_48,&local_58);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,(Instruction *)def,&local_48);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_48);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool LoopFusion::IsUsedInLoop(Instruction* instruction, Loop* loop) {
  auto not_used = context_->get_def_use_mgr()->WhileEachUser(
      instruction, [this, loop](Instruction* user) {
        auto block_id = context_->get_instr_block(user)->id();
        return !loop->IsInsideLoop(block_id);
      });

  return !not_used;
}